

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemsave.c
# Opt level: O1

LispPTR vmem_save(char *sysout_file_name)

{
  uint uVar1;
  long lVar2;
  LispPTR *pLVar3;
  IFPAGE *pIVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  IFPAGE *pIVar8;
  ulong uVar9;
  DLword *__buf;
  __off_t _Var10;
  ssize_t sVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint longwordcount;
  long lVar15;
  int iVar16;
  DLword *page;
  bool bVar17;
  uint uVar18;
  long lVar19;
  char tempname [4096];
  char local_1038 [4104];
  
  pLVar3 = FPtoVP;
  uVar1 = InterfacePage->nactivepages;
  iVar5 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar5 != 0) {
    return 0xe0006;
  }
  sprintf(local_1038,"%s-temp",sysout_file_name);
  alarm(TIMEOUT_TIME);
  piVar7 = __errno_location();
  do {
    *piVar7 = 0;
    iVar5 = open(sysout_file_name,1,0x1b6);
    if (iVar5 != -1) {
      alarm(0);
      alarm(TIMEOUT_TIME);
      goto LAB_0013b087;
    }
  } while (*piVar7 == 4);
  alarm(0);
  if (*piVar7 != 2) {
    return 0xe0003;
  }
  goto LAB_0013b0a5;
  while (lVar2 = lVar15, lVar15 < (long)(ulong)uVar1) {
LAB_0013b213:
    uVar14 = uVar14 + 1;
    lVar15 = lVar2 + 1;
    iVar6 = iVar6 + -1;
    if (uVar14 != pLVar3[lVar2 + 2]) break;
  }
  iVar16 = iVar16 - iVar6;
  uVar13 = (ulong)(uint)-iVar6;
LAB_0013b236:
  page = Lisp_world + (pLVar3[lVar19 + 1] << 8);
  iVar16 = iVar16 + -1;
  uVar18 = (uint)uVar13;
  longwordcount = uVar18 << 7;
  word_swap_page(page,longwordcount);
  uVar14 = TIMEOUT_TIME;
  if (maxpages < uVar18) {
    bVar17 = maxpages < uVar18;
    __buf = page;
    if (maxpages < uVar18) {
      do {
        alarm(TIMEOUT_TIME);
        while( true ) {
          *piVar7 = 0;
          uVar9 = write(iVar5,__buf,(ulong)maxpages << 9);
          if (uVar9 != 0xffffffffffffffff) break;
          if (*piVar7 != 4) {
            alarm(0);
            err_mess("write",*piVar7);
            uVar12 = (uint)(*piVar7 != 0x7a) * 3 + 0xe0002;
            if (*piVar7 == 0x1c) {
              uVar12 = 0xe0002;
            }
            uVar9 = 0xffffffffffffffff;
            goto LAB_0013b40b;
          }
        }
        alarm(0);
        __buf = __buf + (maxpages << 8);
        uVar18 = (int)uVar13 - maxpages;
        uVar13 = (ulong)uVar18;
        bVar17 = maxpages < uVar18;
      } while (maxpages < uVar18);
    }
    if (uVar18 != 0) {
      alarm(TIMEOUT_TIME);
      do {
        *piVar7 = 0;
        uVar9 = write(iVar5,__buf,(ulong)(uVar18 << 9));
        if (uVar9 != 0xffffffffffffffff) break;
      } while (*piVar7 == 4);
      alarm(0);
    }
LAB_0013b40b:
    if (bVar17) {
      bVar17 = false;
      goto LAB_0013b479;
    }
  }
  else {
    TIMEOUT_TIME = (int)(uVar13 >> 3) + TIMEOUT_TIME;
    alarm(TIMEOUT_TIME);
    do {
      *piVar7 = 0;
      uVar9 = write(iVar5,page,(ulong)(uVar18 << 9));
      if (uVar9 != 0xffffffffffffffff) break;
    } while (*piVar7 == 4);
    alarm(0);
    TIMEOUT_TIME = uVar14;
  }
  word_swap_page(page,longwordcount);
  bVar17 = true;
  if (uVar9 == 0xffffffffffffffff) {
    err_mess("write",*piVar7);
    uVar12 = (uint)(*piVar7 != 0x7a) * 3 + 0xe0002;
    if (*piVar7 == 0x1c) {
      uVar12 = 0xe0002;
    }
    uVar9 = 0xffffffffffffffff;
    bVar17 = false;
  }
LAB_0013b479:
  pIVar4 = (IFPAGE *)(ulong)uVar12;
  if (!bVar17) {
    return uVar12;
  }
LAB_0013b494:
  pIVar8 = pIVar4;
  iVar16 = iVar16 + 1;
  if ((int)uVar1 <= iVar16) goto LAB_0013b4aa;
  goto LAB_0013b15d;
  while (*piVar7 == 4) {
LAB_0013b087:
    *piVar7 = 0;
    iVar16 = close(iVar5);
    if (iVar16 != -1) break;
  }
  alarm(0);
LAB_0013b0a5:
  alarm(TIMEOUT_TIME);
  while( true ) {
    *piVar7 = 0;
    iVar5 = open(local_1038,0x241,0x1b6);
    if (iVar5 != -1) break;
    if (*piVar7 != 4) {
      alarm(0);
      err_mess("open",*piVar7);
      return 0xe0003;
    }
  }
  alarm(0);
  pIVar8 = InterfacePage;
  InterfacePage->machinetype = 3;
  if ((ushort)*STORAGEFULLSTATE_word == 1) {
    *STORAGEFULLSTATE_word = 0;
    uVar9 = 0;
    pIVar8 = InterfacePage;
  }
  else {
    uVar9 = (ulong)(uint)(ushort)*STORAGEFULLSTATE_word;
  }
  pIVar8->storagefullstate = (DLword)uVar9;
  if (0 < (int)uVar1) {
    iVar16 = 0;
LAB_0013b15d:
    lVar19 = (long)iVar16;
    uVar14 = pLVar3[lVar19 + 1];
    pIVar4 = (IFPAGE *)((ulong)pIVar8 & 0xffffffff);
    if (uVar14 < 0xffff0000) {
      uVar12 = (uint)pIVar8;
      alarm(TIMEOUT_TIME);
      do {
        *piVar7 = 0;
        _Var10 = lseek(iVar5,(long)(iVar16 << 9),0);
        if (_Var10 != -1) {
          uVar13 = 0;
          alarm(0);
          if ((pLVar3[lVar19 + 1] != uVar14) || ((int)uVar1 <= iVar16)) goto LAB_0013b236;
          iVar6 = 0;
          lVar2 = lVar19;
          goto LAB_0013b213;
        }
      } while (*piVar7 == 4);
      bVar17 = false;
      alarm(0);
      err_mess("lseek",*piVar7);
      uVar12 = 0xe0004;
      goto LAB_0013b479;
    }
    goto LAB_0013b494;
  }
LAB_0013b4aa:
  alarm(TIMEOUT_TIME);
  while( true ) {
    *piVar7 = 0;
    _Var10 = lseek(iVar5,0x200,0);
    if (_Var10 != -1) break;
    if (*piVar7 != 4) {
      alarm(0);
      err_mess("lseek",*piVar7);
      return 0xe0004;
    }
  }
  alarm(0);
  word_swap_page(InterfacePage,0x80);
  alarm(TIMEOUT_TIME);
  while( true ) {
    *piVar7 = 0;
    sVar11 = write(iVar5,InterfacePage,0x200);
    if (sVar11 != -1) break;
    if (*piVar7 != 4) {
      alarm(0);
      word_swap_page(InterfacePage,0x80);
      err_mess("write",*piVar7);
      if (*piVar7 == 0x1c) {
        return 0xe0002;
      }
      return (uint)(*piVar7 != 0x7a) * 3 + 0xe0002;
    }
  }
  alarm(0);
  word_swap_page(InterfacePage,0x80);
  alarm(TIMEOUT_TIME);
  while( true ) {
    *piVar7 = 0;
    iVar16 = close(iVar5);
    if (iVar16 != -1) break;
    if (*piVar7 != 4) {
      alarm(0);
      return 0xe0005;
    }
  }
  alarm(0);
  alarm(TIMEOUT_TIME);
  do {
    *piVar7 = 0;
    iVar5 = unlink(sysout_file_name);
    if (iVar5 != -1) {
      alarm(0);
      goto LAB_0013b62b;
    }
  } while (*piVar7 == 4);
  alarm(0);
  if (*piVar7 != 2) {
    return 0xe0003;
  }
LAB_0013b62b:
  alarm(TIMEOUT_TIME);
  do {
    *piVar7 = 0;
    iVar5 = rename(local_1038,sysout_file_name);
    if (iVar5 != -1) {
      alarm(0);
      return 0;
    }
  } while (*piVar7 == 4);
  vmem_save_cold_1();
  return 0xe0005;
}

Assistant:

LispPTR vmem_save(char *sysout_file_name)
{
  int sysout; /* SysoutFile descriptor */
#ifdef BIGVM
  unsigned int *fptovp;
#else
  DLword *fptovp; /* FPTOVP */
#endif          /* BIGVM */
  int vmemsize; /* VMEMSIZE */
  int i;
  char tempname[MAXPATHLEN];
  ssize_t rsize;
  off_t roff;
  int rval;
#ifndef DOS
  extern int ScreenLocked;
  extern DLword *EmCursorX68K;
  extern DLword *EmCursorY68K;
  extern DLword NullCursor[];
  extern DLword *EmCursorBitMap68K;
#endif /* DOS */

/* remove cursor image from screen */

#ifdef   DOS
  /*  For DOS, must also take the mouse cursor away (it's  */
  /*  written into the display-region bitmap).	     */
  currentdsp->device.locked++;
  (currentdsp->mouse_invisible)(currentdsp, IOPage);
#endif /* SUNDISPLAY || DOS */

  /* set FPTOVP */
  fptovp = FPtoVP + 1;

  /* set VMEMSIZE */
  vmemsize = InterfacePage->nactivepages;

  /*	[HH:6-Jan-89]
          Sequence of save image
          (1) Sysout image is saved to a temporary file, tempname.
          (2) if a specified file, sysout_file_name, is exist, the file is removed.
          (3) the temporary file is renamed to the specified file.
  */

  SETJMP(FILETIMEOUT);
#ifdef DOS
  /* Bloddy 8 char filenames in dos ... /jarl */
  make_old_version(tempname, sysout_file_name);
#else  /* DOS */
  sprintf(tempname, "%s-temp", sysout_file_name);
#endif /* DOS */

  /* Confirm protection of specified file by open/close */

  TIMEOUT(sysout = open(sysout_file_name, O_WRONLY, 0666));
  if (sysout == -1) {
    /* No file error skip return. */
    if (errno != ENOENT) return (FILECANNOTOPEN); /* No such file error.*/
  } else
    TIMEOUT(rval = close(sysout));

  /* open temp file */
  TIMEOUT(sysout = open(tempname, O_WRONLY | O_CREAT | O_TRUNC, 0666));
  if (sysout == -1) {
    err_mess("open", errno);
    return (FILECANNOTOPEN);
  }

  InterfacePage->machinetype = MACHINETYPE_MAIKO;

  /* Restore storagefull state */
  if (((*STORAGEFULLSTATE_word) & 0xffff) == SFS_NOTSWITCHABLE) {
    /* This sysout uses only 8 Mbyte lisp space.
       It may be able to use this SYSOUT which has more than
       8 Mbyte lisp space.
       To enable to expand lisp space, \\STORAGEFULLSTATE
       should be NIL.
    */
    *STORAGEFULLSTATE_word = NIL;
    InterfacePage->storagefullstate = NIL;
  } else {
    /*  Otherwise, just restore storagefullstate in IFPAGE */
    InterfacePage->storagefullstate = (*STORAGEFULLSTATE_word) & 0xffff;
  }

/* First, sort fptovp table, trying to get pages contiguous */
#ifndef BIGVM
#ifndef BYTESWAP
  /* Byte-swapped machines don't sort the table right. */
  sort_fptovp(fptovp, vmemsize);
#endif
#endif

  /* store vmem to sysoutfile */

  for (i = 0; i < vmemsize; i++) {
    if (GETPAGEOK(fptovp, i) != 0177777) {
      unsigned int oldfptovp = GETFPTOVP(fptovp, i);
      unsigned int saveoldfptovp = oldfptovp;
      unsigned int contig_pages = 0;
      DLword *base_addr;

      TIMEOUT(roff = lseek(sysout, i * BYTESPER_PAGE, SEEK_SET));
      if (roff == -1) {
        err_mess("lseek", errno);
        return (FILECANNOTSEEK);
      }
      base_addr = Lisp_world + (GETFPTOVP(fptovp, i) * DLWORDSPER_PAGE);

      /* Now, let's see how many pages we can dump */
      while (GETFPTOVP(fptovp, i) == oldfptovp && i < vmemsize) {
        contig_pages++; oldfptovp++; i++;
      }
      i--; /* Previous loop always overbumps i */
      DBPRINT(("%4d: writing %d pages from %tx (%d)\n", i, contig_pages, (char *)base_addr - (char *)Lisp_world, saveoldfptovp));

#ifdef BYTESWAP
      word_swap_page(base_addr, contig_pages * CELLSPER_PAGE);
#endif /* BYTESWAP */

      if (contig_pages > maxpages) {
        DLword *ba = base_addr;
        unsigned int pc = contig_pages;
        while (pc > maxpages) {
          TIMEOUT(rsize = write(sysout, ba, (size_t)maxpages * BYTESPER_PAGE));
          if (rsize == -1) {
            err_mess("write", errno);
            return ((errno == ENOSPC) || (errno == EDQUOT)) ? NOFILESPACE : FILECANNOTWRITE;
          }
          ba += maxpages * DLWORDSPER_PAGE;
          pc -= maxpages;
        }
        if (pc > 0) TIMEOUT(rsize = write(sysout, ba, pc * BYTESPER_PAGE));
      } else {
        unsigned int oldTT = TIMEOUT_TIME;
        /* As we can spend longer than TIMEOUT_TIME doing a big
           write, we adjust the timeout temporarily here */
        TIMEOUT_TIME += contig_pages >> 3;
        TIMEOUT(rsize = write(sysout, base_addr, contig_pages * BYTESPER_PAGE));
        TIMEOUT_TIME = oldTT;
      }
#ifdef BYTESWAP
      word_swap_page(base_addr, contig_pages * CELLSPER_PAGE);
#endif /* BYTESWAP */

      if (rsize == -1) {
        err_mess("write", errno);
	return ((errno == ENOSPC) || (errno == EDQUOT)) ? NOFILESPACE : FILECANNOTWRITE;
      }
    }
  }

  /* seek to IFPAGE */
  TIMEOUT(roff = lseek(sysout, (long)FP_IFPAGE, SEEK_SET));
  if (roff == -1) {
    err_mess("lseek", errno);
    return (FILECANNOTSEEK);
  }
#ifdef BYTESWAP
  word_swap_page(InterfacePage, CELLSPER_PAGE);
#endif /* BYTESWAP */

  TIMEOUT(rsize = write(sysout, (char *)InterfacePage, BYTESPER_PAGE));
#ifdef BYTESWAP
  word_swap_page(InterfacePage, CELLSPER_PAGE);
#endif /* BYTESWAP */

  if (rsize == -1) {
    err_mess("write", errno);
	return ((errno == ENOSPC) || (errno == EDQUOT)) ? NOFILESPACE : FILECANNOTWRITE;
  }

#ifdef OS5
  /* Seems to write all pages at close, so timeout
     is WAY to short, no matter how big.  JDS 960925 */
  rval = close(sysout);
#else
  TIMEOUT(rval = close(sysout));
#endif /* OS5 */
  if (rval == -1) { return (FILECANNOTWRITE); }

  TIMEOUT(rval = unlink(sysout_file_name));
  if (rval == -1) {
    /* No file error skip return. */
    if (errno != ENOENT) /* No such file error.*/
      return (FILECANNOTOPEN);
  }

  TIMEOUT(rval = rename(tempname, sysout_file_name));
  if (rval == -1) {
    (void)fprintf(stderr, "sysout is saved to temp file, %s.", tempname);
    return (FILECANNOTWRITE);
  }

/* restore cursor image to screen */
#ifdef DOS
  /* Must also put the mouse back. */
  (currentdsp->mouse_visible)(IOPage->dlmousex, IOPage->dlmousey);
  currentdsp->device.locked--;

#endif /* SUNDISPLAY */

  /*printf("vmem is saved completely.\n");*/
  return (COMPLETESYSOUT);
}